

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_32f82::BoidsPlugIn::nextPD(BoidsPlugIn *this)

{
  ProximityDatabase *pPVar1;
  Boid *pBVar2;
  int iVar3;
  LQProximityDatabase<OpenSteer::AbstractVehicle_*> *this_00;
  ProximityDatabase *pPVar4;
  undefined4 extraout_var;
  pointer ppBVar5;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  pPVar1 = this->pd;
  iVar3 = this->cyclePD;
  iVar3 = (iVar3 - ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
  this->cyclePD = iVar3;
  if (iVar3 == 1) {
    pPVar4 = (ProximityDatabase *)operator_new(0x20);
    pPVar4->_vptr_AbstractProximityDatabase =
         (_func_int **)&PTR__BruteForceProximityDatabase_00177ae8;
    pPVar4[1]._vptr_AbstractProximityDatabase = (_func_int **)0x0;
    pPVar4[2]._vptr_AbstractProximityDatabase = (_func_int **)0x0;
    pPVar4[3]._vptr_AbstractProximityDatabase = (_func_int **)0x0;
    this->pd = pPVar4;
  }
  else if (iVar3 == 0) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 10.0;
    local_50.y = 10.0;
    local_50.z = 10.0;
    local_60.x = 110.0;
    local_60.y = 110.0;
    local_60.z = 110.0;
    this_00 = (LQProximityDatabase<OpenSteer::AbstractVehicle_*> *)operator_new(0x10);
    OpenSteer::LQProximityDatabase<OpenSteer::AbstractVehicle_*>::LQProximityDatabase
              (this_00,&local_40,&local_60,&local_50);
    this->pd = (ProximityDatabase *)this_00;
  }
  for (ppBVar5 = (this->flock).
                 super__Vector_base<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppBVar5 !=
      (this->flock).
      super__Vector_base<(anonymous_namespace)::Boid_*,_std::allocator<(anonymous_namespace)::Boid_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppBVar5 = ppBVar5 + 1) {
    pBVar2 = *ppBVar5;
    pPVar4 = this->pd;
    if (pBVar2->proximityToken != (ProximityToken *)0x0) {
      (*pBVar2->proximityToken->_vptr_AbstractTokenForProximityDatabase[1])();
    }
    iVar3 = (*pPVar4->_vptr_AbstractProximityDatabase[2])(pPVar4,pBVar2);
    pBVar2->proximityToken = (ProximityToken *)CONCAT44(extraout_var,iVar3);
  }
  if (pPVar1 != (ProximityDatabase *)0x0) {
    (*pPVar1->_vptr_AbstractProximityDatabase[1])(pPVar1);
  }
  return;
}

Assistant:

void nextPD (void)
        {
            // save pointer to old PD
            ProximityDatabase* oldPD = pd;

            // allocate new PD
            const int totalPD = 2;
            switch (cyclePD = (cyclePD + 1) % totalPD)
            {
            case 0:
                {
                    const Vec3 center;
                    const float div = 10.0f;
                    const Vec3 divisions (div, div, div);
                    const float diameter = Boid::worldRadius * 1.1f * 2;
                    const Vec3 dimensions (diameter, diameter, diameter);
                    typedef LQProximityDatabase<AbstractVehicle*> LQPDAV;
                    pd = new LQPDAV (center, dimensions, divisions);
                    break;
                }
            case 1:
                {
                    pd = new BruteForceProximityDatabase<AbstractVehicle*> ();
                    break;
                }
            }

            // switch each boid to new PD
            for (iterator i=flock.begin(); i!=flock.end(); i++) (**i).newPD(*pd);

            // delete old PD (if any)
            delete oldPD;
        }